

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::App::operator[](App *this,char *option_name)

{
  Option *pOVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000008;
  App *in_stack_00000010;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  pOVar1 = get_option(in_stack_00000010,in_stack_00000008);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::allocator<char>::~allocator(&local_31);
  return pOVar1;
}

Assistant:

const Option *operator[](const char *option_name) const { return get_option(option_name); }